

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osThread.cpp
# Opt level: O2

int __thiscall
osThread::Create(osThread *this,ThreadEntryPtr entry,char *name,int stackSize,int priority,
                void *param)

{
  long lVar1;
  osThread **ppoVar2;
  long lVar3;
  
  if (IsInitialized == '\0') {
    Initialize();
  }
  snprintf(this->Name,0x20,"%s",name);
  this->Priority = priority;
  this->Entry = entry;
  this->Param = param;
  pthread_create(&this->m_thread,(pthread_attr_t *)0x0,ThreadEntry,this);
  osEvent::Wait(&this->ThreadStart,
                "/workspace/llm4binary/github/license_c_cmakelists/rkimball[P]tinytcp/os_support/osThread.cpp"
                ,0xcd,-1);
  osMutex::Take(&Mutex,
                "/workspace/llm4binary/github/license_c_cmakelists/rkimball[P]tinytcp/os_support/osThread.cpp"
                ,0xd0);
  lVar3 = 0;
  do {
    if (lVar3 == 0x30) goto LAB_001096a3;
    lVar1 = lVar3 + 1;
    ppoVar2 = Threads + lVar3;
    lVar3 = lVar1;
  } while (*ppoVar2 != (osThread *)0x0);
  *(osThread **)(&tlsKey + lVar1 * 2) = this;
LAB_001096a3:
  osMutex::Give(&Mutex);
  return 0;
}

Assistant:

int osThread::Create(
    ThreadEntryPtr entry, const char* name, int stackSize, int priority, void* param)
{
    if (!IsInitialized)
    {
        Initialize();
    }
    int i;
    int rc = 0;

    snprintf(Name, NAME_LENGTH_MAX, "%s", name);
    Priority = priority;

#ifdef _WIN32
    WINTHREADPARAMPTR threadParam;

    // Allocate heap memory for thread parameter
    threadParam =
        (WINTHREADPARAMPTR)HeapAlloc(GetProcessHeap(), HEAP_ZERO_MEMORY, sizeof(WinThreadParam));

    // Set thread parameter values
    threadParam->Entry = entry;
    threadParam->Param = param;
    threadParam->Thread = this;

    DWORD tid;

    // Create thread
    Handle = CreateThread(nullptr, 0, WinThreadEntry, threadParam, 0, &tid);
    ThreadId = tid;
#elif __linux__

    // Set thread parameter values
    Entry = entry;
    Param = param;
    pthread_create(&m_thread, nullptr, ThreadEntry, this);
    ThreadStart.Wait(__FILE__, __LINE__);
#endif

    Mutex.Take(__FILE__, __LINE__);
    for (i = 0; i < MAX_THREADS; i++)
    {
        if (Threads[i] == nullptr)
        {
            Threads[i] = this;
            break;
        }
    }
    Mutex.Give();

    return rc;
}